

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat __thiscall Mat::GaussLin(Mat *this,Mat *rhs,int n)

{
  undefined8 uVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  Mat *pMVar6;
  ulong uVar7;
  uint uVar8;
  uint in_ECX;
  undefined4 in_register_00000014;
  int *piVar9;
  long lVar10;
  double *extraout_RDX;
  double *extraout_RDX_00;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  int i;
  double *pdVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  double *pdVar22;
  double dVar23;
  Mat MVar24;
  Mat Aux;
  Mat *X;
  double *local_b0;
  double *local_a8;
  Mat local_88;
  Mat *local_78;
  long local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  double *local_48;
  Mat local_40;
  double *pdVar11;
  
  piVar9 = (int *)CONCAT44(in_register_00000014,n);
  uVar12 = (ulong)in_ECX;
  local_78 = this;
  Mat(&local_88,rhs);
  pMVar6 = local_78;
  if (local_88.n_rows_ == piVar9[1] * *piVar9) {
    uVar8 = in_ECX - 1;
    if (1 < (int)in_ECX) {
      local_70 = (long)local_88.n_cols_;
      iVar3 = rhs->n_cols_;
      lVar10 = (long)iVar3;
      local_58 = (ulong)uVar8;
      lVar4 = *(long *)(piVar9 + 2);
      local_60 = local_70 * 8 + 8;
      local_68 = lVar10 * 8 + 8;
      local_a8 = local_88.v_ + lVar10;
      uVar19 = 1;
      local_b0 = local_88.v_;
      pdVar11 = local_88.v_;
      pdVar13 = local_88.v_;
      uVar14 = uVar12;
      pdVar15 = local_88.v_ + local_70;
      uVar16 = 0;
      pdVar22 = local_88.v_;
      do {
        local_48 = pdVar15;
        local_50 = uVar16 + 1;
        uVar20 = uVar16 & 0xffffffff;
        pdVar15 = local_48;
        uVar21 = uVar19;
        do {
          uVar7 = uVar21 & 0xffffffff;
          if (ABS(*pdVar15) <= ABS(local_88.v_[uVar16 + (int)uVar20 * local_70])) {
            uVar7 = uVar20;
          }
          uVar20 = uVar7;
          uVar21 = uVar21 + 1;
          pdVar15 = pdVar15 + local_70;
          iVar18 = (int)uVar20;
        } while (uVar12 != uVar21);
        if (uVar16 != uVar20) {
          if (uVar16 < uVar12) {
            uVar21 = 0;
            do {
              dVar23 = pdVar22[uVar21];
              pdVar13[uVar21] = local_b0[(long)(iVar3 * iVar18) + uVar21];
              local_b0[(long)(iVar3 * iVar18) + uVar21] = dVar23;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
          lVar17 = *(long *)(piVar9 + 2);
          uVar1 = *(undefined8 *)(lVar17 + uVar16 * 8);
          *(undefined8 *)(lVar17 + uVar16 * 8) = *(undefined8 *)(lVar17 + (long)iVar18 * 8);
          *(undefined8 *)(lVar17 + (long)iVar18 * 8) = uVar1;
        }
        uVar21 = uVar19;
        pdVar15 = local_a8;
        do {
          dVar23 = local_88.v_[uVar16 + uVar21 * lVar10];
          dVar2 = local_88.v_[(iVar3 + 1) * (int)uVar16];
          local_88.v_[uVar16 + uVar21 * lVar10] = 0.0;
          uVar20 = 1;
          do {
            pdVar15[uVar20] = pdVar11[uVar20] * -(dVar23 / dVar2) + pdVar15[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          *(double *)(lVar4 + uVar21 * 8) =
               *(double *)(lVar4 + uVar21 * 8) - (dVar23 / dVar2) * *(double *)(lVar4 + uVar16 * 8);
          uVar21 = uVar21 + 1;
          pdVar15 = pdVar15 + lVar10;
        } while (uVar21 != uVar12);
        uVar19 = uVar19 + 1;
        local_b0 = local_b0 + 1;
        pdVar13 = pdVar13 + lVar10 + 1;
        pdVar22 = pdVar22 + local_70 + 1;
        uVar14 = uVar14 - 1;
        pdVar11 = pdVar11 + lVar10 + 1;
        local_a8 = local_a8 + lVar10 + 1;
        pdVar15 = local_48 + local_70 + 1;
        uVar16 = local_50;
      } while (local_50 != local_58);
    }
    Mat(local_78,in_ECX);
    lVar4 = *(long *)(piVar9 + 2);
    iVar3 = rhs->n_cols_;
    pdVar11 = pMVar6->v_;
    pdVar11[(int)uVar8] =
         *(double *)(lVar4 + (long)(int)uVar8 * 8) /
         local_88.v_[(long)(int)(uVar8 * iVar3 + in_ECX) + -1];
    if (1 < (int)in_ECX) {
      pdVar15 = local_88.v_ + (long)iVar3 * (long)(int)(in_ECX - 2) + uVar12;
      pdVar13 = pdVar11 + uVar12;
      iVar18 = 0;
      lVar10 = (long)(int)(in_ECX - 2);
      do {
        dVar23 = 0.0;
        if (lVar10 < (long)(uVar12 - 1)) {
          lVar17 = -1;
          do {
            dVar23 = dVar23 - pdVar15[lVar17] * pdVar13[lVar17];
            lVar17 = lVar17 + 1;
          } while (iVar18 != (int)lVar17);
        }
        pdVar11[lVar10] =
             (dVar23 + *(double *)(lVar4 + lVar10 * 8)) / local_88.v_[(iVar3 + 1) * (int)lVar10];
        pdVar15 = pdVar15 + ~(long)iVar3;
        pdVar13 = pdVar13 + -1;
        iVar18 = iVar18 + 1;
        bVar5 = 0 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar5);
    }
    MVar24 = operator~(&local_40);
    pdVar11 = MVar24.v_;
    if (local_40.v_ != (double *)0x0) {
      operator_delete__(local_40.v_);
      pdVar11 = extraout_RDX;
    }
    if (local_88.v_ != (double *)0x0) {
      operator_delete__(local_88.v_);
      pdVar11 = extraout_RDX_00;
    }
    MVar24.v_ = pdVar11;
    MVar24._0_8_ = pMVar6;
    return MVar24;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR: Invalid dimension in gaussLin",0x24);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(1);
}

Assistant:

Mat Mat::GaussLin(const Mat rhs,int n) const
{
	Mat Aux = (*this);
	if ( (Aux.n_rows_!=rhs.Size() )) {
    cerr << "ERROR: Invalid dimension in gaussLin" << endl;
    exit(1);
	};
	double m;
	for (int k=0; k<n-1; k++ )
	{
		int l=k;
		// Rearrangement
		for (int i=k+1; i<n; i++)
		{
			if (abs(Aux(i,k)) > abs(Aux(l,k))) 
				l=i;
		}
		if (l!=k)
		{
			for (int j = k; j < n; j++)
			{
				m = Aux(k,j);
				Aux.v_[k*n_cols_+j] = Aux.v_[l*n_cols_+j];
				Aux.v_[l*n_cols_+j] = m;
			}
			m = rhs.v_[k];
			rhs.v_[k] = rhs.v_[l];
		    rhs.v_[l] = m;
		}
		for (int i = k+1; i < n; i++)
		{
			m = Aux.v_[i*n_cols_+k] / Aux.v_[k*n_cols_+k];
			Aux.v_[i*n_cols_+k] = 0.0;
			for ( int j = k+1; j < n; j++)
			{
				Aux.v_[i*n_cols_ + j] = Aux.v_[i*n_cols_ + j] - m * Aux.v_[k*n_cols_+j];
			}
			rhs.v_[i] = rhs.v_[i] - m * rhs.v_[k] ; 
		}
	}
	Mat X(n);
	X.v_[n-1] = rhs.v_[n-1] / Aux.v_[(n-1)*n_cols_+n-1];
	for (int i = n-2 ;i >-1 ;i--)
	{
		double s = 0.0;		
		for (int j = i+1 ; j < n; j++)
			s = s - Aux.v_[i*n_cols_ + j] * X.v_[j];
		X.v_[i] = (rhs.v_[i] + s)/ Aux.v_[i*n_cols_ + i];
	}
	~Aux;
	return X;
}